

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::SPxLPBase<double>::added2Set
          (SPxLPBase<double> *this,SVSetBase<double> *set,SVSetBase<double> *addset,int n)

{
  int iVar1;
  uint uVar2;
  Item *pIVar3;
  DataKey *pDVar4;
  Item *pIVar5;
  DataKey *pDVar6;
  Nonzero<double> *pNVar7;
  Nonzero<double> *pNVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  DataArray<int> moreArray;
  DataArray<int> DStack_48;
  
  if (n != 0) {
    DataArray<int>::DataArray(&DStack_48,(set->set).thenum,0,1.2);
    for (uVar9 = (ulong)(uint)(set->set).thenum; 0 < (int)uVar9; uVar9 = uVar9 - 1) {
      DStack_48.data[uVar9 - 1] = 0;
    }
    iVar11 = (addset->set).thenum;
    pIVar3 = (addset->set).theitem;
    pDVar4 = (addset->set).thekey;
    iVar10 = 0;
    for (lVar12 = (long)(iVar11 - n); lVar12 < iVar11; lVar12 = lVar12 + 1) {
      iVar1 = pDVar4[lVar12].idx;
      uVar2 = pIVar3[iVar1].data.super_SVectorBase<double>.memused;
      lVar13 = (ulong)uVar2 * 0x10 + -8;
      for (uVar14 = uVar2; 0 < (int)uVar14; uVar14 = uVar14 - 1) {
        DStack_48.data
        [*(int *)((long)&(pIVar3[iVar1].data.super_SVectorBase<double>.m_elem)->val + lVar13)] =
             DStack_48.data
             [*(int *)((long)&(pIVar3[iVar1].data.super_SVectorBase<double>.m_elem)->val + lVar13)]
             + 1;
        lVar13 = lVar13 + -0x10;
      }
      iVar10 = iVar10 + uVar2;
    }
    if ((set->super_ClassArray<soplex::Nonzero<double>_>).themax < iVar10) {
      SVSetBase<double>::memRemax(set,iVar10);
    }
    for (uVar9 = (ulong)(uint)(set->set).thenum; 0 < (int)uVar9; uVar9 = uVar9 - 1) {
      pIVar3 = (set->set).theitem;
      iVar11 = (set->set).thekey[uVar9 - 1].idx;
      iVar10 = pIVar3[iVar11].data.super_SVectorBase<double>.memused;
      SVSetBase<double>::xtend
                (set,(SVectorBase<double> *)(pIVar3 + iVar11),DStack_48.data[uVar9 - 1] + iVar10);
      (set->set).theitem[(set->set).thekey[uVar9 - 1].idx].data.super_SVectorBase<double>.memused =
           DStack_48.data[uVar9 - 1] + iVar10;
      DStack_48.data[uVar9 - 1] = iVar10;
    }
    iVar11 = (addset->set).thenum;
    pIVar3 = (addset->set).theitem;
    pDVar4 = (addset->set).thekey;
    for (lVar12 = (long)(iVar11 - n); lVar12 < iVar11; lVar12 = lVar12 + 1) {
      iVar11 = pDVar4[lVar12].idx;
      uVar9 = (ulong)(uint)pIVar3[iVar11].data.super_SVectorBase<double>.memused;
      pIVar5 = (set->set).theitem;
      pDVar6 = (set->set).thekey;
      lVar13 = uVar9 * 0x10 + -8;
      for (; 0 < (int)uVar9; uVar9 = (ulong)((int)uVar9 - 1)) {
        pNVar7 = pIVar3[iVar11].data.super_SVectorBase<double>.m_elem;
        iVar10 = *(int *)((long)&pNVar7->val + lVar13);
        iVar1 = DStack_48.data[iVar10];
        DStack_48.data[iVar10] = iVar1 + 1;
        pNVar8 = pIVar5[pDVar6[iVar10].idx].data.super_SVectorBase<double>.m_elem;
        pNVar8[iVar1].idx = (int)lVar12;
        pNVar8[iVar1].val = *(double *)((long)pNVar7 + lVar13 + -8);
        lVar13 = lVar13 + -0x10;
      }
      iVar11 = (addset->set).thenum;
    }
    DataArray<int>::~DataArray(&DStack_48);
  }
  return;
}

Assistant:

void added2Set(SVSetBase<R>& set, const SVSetBase<R>& addset, int n)
   {

      if(n == 0)
         return;

      DataArray<int> moreArray(set.num());
      int* more = moreArray.get_ptr();

      for(int i = set.num() - 1; i >= 0; --i)
         more[i] = 0;

      int tot = 0;
      int end = addset.num();

      for(int i = addset.num() - n; i < end; ++i)
      {
         const SVectorBase<R>& vec = addset[i];

         tot += vec.size();

         for(int j = vec.size() - 1; j >= 0; --j)
            more[vec.index(j)]++;
      }

      if(set.memMax() < tot)
         set.memRemax(tot);

      for(int i = set.num() - 1; i >= 0; --i)
      {
         int j = set[i].size();
         set.xtend(set[i], j + more[i]);
         set[i].set_size(j + more[i]);
         more[i] = j;
      }

      for(int i = addset.num() - n; i < addset.num(); ++i)
      {
         const SVectorBase<R>& vec = addset[i];

         for(int j = vec.size() - 1; j >= 0; --j)
         {
            int k = vec.index(j);
            int m = more[k]++;
            SVectorBase<R>& l_xtend = set[k];
            l_xtend.index(m) = i;
            l_xtend.value(m) = vec.value(j);
         }
      }
   }